

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_worker_ctor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv)

{
  BOOL BVar1;
  JSAtom JVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  JSWorkerMessagePipe *pJVar6;
  JSContext *in_RDI;
  JSValue JVar7;
  JSAtom basename_atom;
  char *basename;
  char *filename;
  int ret;
  JSValue obj;
  pthread_attr_t attr;
  pthread_t tid;
  WorkerFuncArgs *args;
  JSRuntime *rt;
  JSValue in_stack_ffffffffffffff18;
  JSContext *ctx_00;
  JSValue in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff38 [16];
  int64_t iVar8;
  undefined4 in_stack_ffffffffffffff48;
  JSWorkerMessagePipe *send_pipe;
  undefined8 in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff88 [16];
  pthread_t local_50;
  undefined8 *local_48;
  JSRuntime *local_40;
  JSContext *local_28;
  long lVar10;
  undefined1 in_stack_fffffffffffffff0 [16];
  JSValue JVar9;
  
  lVar10 = in_stack_fffffffffffffff0._4_8_;
  local_28 = in_RDI;
  local_40 = JS_GetRuntime(in_RDI);
  local_48 = (undefined8 *)0x0;
  send_pipe = (JSWorkerMessagePipe *)0x3;
  BVar1 = is_main_thread((JSRuntime *)in_stack_ffffffffffffff18.tag);
  if (BVar1 == 0) {
    JVar7 = JS_ThrowTypeError(local_28,"cannot create a worker inside a worker");
    return JVar7;
  }
  JVar2 = JS_GetScriptOrModuleName
                    (in_stack_ffffffffffffff38._0_8_,in_stack_ffffffffffffff28.tag._4_4_);
  if (JVar2 == 0) {
    JVar7 = JS_ThrowTypeError(local_28,"could not determine calling script or module name");
    return JVar7;
  }
  pcVar4 = JS_AtomToCString((JSContext *)CONCAT44(JVar2,in_stack_ffffffffffffff48),
                            in_stack_ffffffffffffff38._12_4_);
  JS_FreeAtom((JSContext *)in_stack_ffffffffffffff18.tag,in_stack_ffffffffffffff18.u._4_4_);
  ctx_00 = (JSContext *)in_stack_ffffffffffffff18.tag;
  if ((pcVar4 != (char *)0x0) &&
     (pcVar5 = JS_ToCString((JSContext *)0x112c35,in_stack_ffffffffffffff18), pcVar5 != (char *)0x0)
     ) {
    local_48 = (undefined8 *)malloc(0x20);
    if (local_48 != (undefined8 *)0x0) {
      memset(local_48,0,0x20);
      pcVar5 = strdup(pcVar5);
      *local_48 = pcVar5;
      pcVar4 = strdup(pcVar4);
      local_48[1] = pcVar4;
      pJVar6 = js_new_message_pipe();
      local_48[2] = pJVar6;
      if (local_48[2] != 0) {
        pJVar6 = js_new_message_pipe();
        local_48[3] = pJVar6;
        if (local_48[3] != 0) {
          JVar7 = js_worker_ctor_internal
                            ((JSContext *)in_stack_ffffffffffffff80,
                             (JSValue)in_stack_ffffffffffffff88,
                             (JSWorkerMessagePipe *)in_stack_ffffffffffffff78,send_pipe);
          iVar8 = JVar7.tag;
          iVar3 = JS_IsException(JVar7);
          if (iVar3 == 0) {
            pthread_attr_init((pthread_attr_t *)&stack0xffffffffffffff78);
            pthread_attr_setdetachstate((pthread_attr_t *)&stack0xffffffffffffff78,1);
            iVar3 = pthread_create(&local_50,(pthread_attr_t *)&stack0xffffffffffffff78,worker_func,
                                   local_48);
            pthread_attr_destroy((pthread_attr_t *)&stack0xffffffffffffff78);
            if (iVar3 == 0) {
              JS_FreeCString((JSContext *)in_stack_ffffffffffffff28.tag,
                             (char *)in_stack_ffffffffffffff28.u.ptr);
              JS_FreeCString((JSContext *)in_stack_ffffffffffffff28.tag,
                             (char *)in_stack_ffffffffffffff28.u.ptr);
              JVar9.tag = iVar8;
              JVar9.u.float64 = JVar7.u.float64;
              return JVar9;
            }
            in_stack_ffffffffffffff28 = JS_ThrowTypeError(local_28,"could not create worker");
          }
          goto LAB_00112e34;
        }
      }
    }
    JVar7 = JS_ThrowOutOfMemory((JSContext *)in_stack_ffffffffffffff28.tag);
    ctx_00 = (JSContext *)JVar7.tag;
  }
LAB_00112e34:
  JS_FreeCString((JSContext *)in_stack_ffffffffffffff28.tag,(char *)in_stack_ffffffffffffff28.u.ptr)
  ;
  JS_FreeCString((JSContext *)in_stack_ffffffffffffff28.tag,(char *)in_stack_ffffffffffffff28.u.ptr)
  ;
  if (local_48 != (undefined8 *)0x0) {
    free((void *)*local_48);
    free((void *)local_48[1]);
    js_free_message_pipe((JSWorkerMessagePipe *)in_stack_ffffffffffffff28.tag);
    js_free_message_pipe((JSWorkerMessagePipe *)in_stack_ffffffffffffff28.tag);
    free(local_48);
  }
  JS_FreeValue(ctx_00,in_stack_ffffffffffffff28);
  JVar7.u.ptr = (void *)(lVar10 << 0x20);
  JVar7.tag = 6;
  return JVar7;
}

Assistant:

static JSValue js_worker_ctor(JSContext *ctx, JSValueConst new_target,
                              int argc, JSValueConst *argv)
{
    JSRuntime *rt = JS_GetRuntime(ctx);
    WorkerFuncArgs *args = NULL;
    pthread_t tid;
    pthread_attr_t attr;
    JSValue obj = JS_UNDEFINED;
    int ret;
    const char *filename = NULL, *basename;
    JSAtom basename_atom;
    
    /* XXX: in order to avoid problems with resource liberation, we
       don't support creating workers inside workers */
    if (!is_main_thread(rt))
        return JS_ThrowTypeError(ctx, "cannot create a worker inside a worker");

    /* base name, assuming the calling function is a normal JS
       function */
    basename_atom = JS_GetScriptOrModuleName(ctx, 1);
    if (basename_atom == JS_ATOM_NULL) {
        return JS_ThrowTypeError(ctx, "could not determine calling script or module name");
    }
    basename = JS_AtomToCString(ctx, basename_atom);
    JS_FreeAtom(ctx, basename_atom);
    if (!basename)
        goto fail;
    
    /* module name */
    filename = JS_ToCString(ctx, argv[0]);
    if (!filename)
        goto fail;

    args = malloc(sizeof(*args));
    if (!args)
        goto oom_fail;
    memset(args, 0, sizeof(*args));
    args->filename = strdup(filename);
    args->basename = strdup(basename);

    /* ports */
    args->recv_pipe = js_new_message_pipe();
    if (!args->recv_pipe)
        goto oom_fail;
    args->send_pipe = js_new_message_pipe();
    if (!args->send_pipe)
        goto oom_fail;

    obj = js_worker_ctor_internal(ctx, new_target,
                                  args->send_pipe, args->recv_pipe);
    if (JS_IsException(obj))
        goto fail;
    
    pthread_attr_init(&attr);
    /* no join at the end */
    pthread_attr_setdetachstate(&attr, PTHREAD_CREATE_DETACHED);
    ret = pthread_create(&tid, &attr, worker_func, args);
    pthread_attr_destroy(&attr);
    if (ret != 0) {
        JS_ThrowTypeError(ctx, "could not create worker");
        goto fail;
    }
    JS_FreeCString(ctx, basename);
    JS_FreeCString(ctx, filename);
    return obj;
 oom_fail:
    JS_ThrowOutOfMemory(ctx);
 fail:
    JS_FreeCString(ctx, basename);
    JS_FreeCString(ctx, filename);
    if (args) {
        free(args->filename);
        free(args->basename);
        js_free_message_pipe(args->recv_pipe);
        js_free_message_pipe(args->send_pipe);
        free(args);
    }
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}